

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,prefix_expression *e)

{
  wostream *pwVar1;
  token_type tVar2;
  char *pcVar3;
  expression *e_00;
  prefix_expression *e_local;
  print_visitor *this_local;
  
  tVar2 = prefix_expression::op(e);
  if (tVar2 == delete_) {
    std::operator<<(this->os_,"delete ");
  }
  else if (tVar2 == new_) {
    std::operator<<(this->os_,"new ");
  }
  else if (tVar2 == typeof_) {
    std::operator<<(this->os_,"typeof ");
  }
  else if (tVar2 == void_) {
    std::operator<<(this->os_,"void ");
  }
  else {
    pwVar1 = this->os_;
    tVar2 = prefix_expression::op(e);
    pcVar3 = op_text(tVar2);
    std::operator<<(pwVar1,pcVar3);
  }
  e_00 = prefix_expression::e(e);
  accept<mjs::print_visitor>(e_00,this);
  return;
}

Assistant:

void operator()(const prefix_expression& e) {
        switch (e.op()) {
        case token_type::delete_: os_ << "delete "; break;
        case token_type::typeof_: os_ << "typeof "; break;
        case token_type::void_:   os_ << "void "; break;
        case token_type::new_:    os_ << "new "; break;
        default:                  os_ << op_text(e.op());
        }
        accept(e.e(), *this);
    }